

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnumMethods.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::EnumNextPrevMethod::~EnumNextPrevMethod(EnumNextPrevMethod *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~EnumNextPrevMethod((EnumNextPrevMethod *)0x1345008);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

EnumNextPrevMethod(KnownSystemName knownNameId, bool next) :
        SystemSubroutine(knownNameId, SubroutineKind::Function), next(next) {}